

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFromIvySeq(Abc_Ntk_t *pNtkOld,Ivy_Man_t *pMan,int fHaig)

{
  Ivy_Man_t *pIVar1;
  Abc_Edge_t AVar2;
  int iVar3;
  Ivy_Init_t IVar4;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar5;
  Ivy_Obj_t *pIVar6;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar7;
  bool bVar8;
  int local_74;
  Ivy_Obj_t *pIStack_70;
  int i;
  Ivy_Obj_t *pTemp;
  Ivy_Obj_t *pNode;
  Abc_Obj_t *pFaninNew1;
  Abc_Obj_t *pFaninNew0;
  Abc_Obj_t *pFaninNew;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  Vec_Int_t *vLatches;
  Vec_Int_t *vNodes;
  Ivy_Man_t *pIStack_18;
  int fHaig_local;
  Ivy_Man_t *pMan_local;
  Abc_Ntk_t *pNtkOld_local;
  
  vNodes._4_4_ = fHaig;
  pIStack_18 = pMan;
  pMan_local = (Ivy_Man_t *)pNtkOld;
  pNtk_00 = Abc_NtkStartFromNoLatches(pNtkOld,ABC_NTK_STRASH,ABC_FUNC_AIG);
  pAVar5 = Abc_AigConst1(pNtk_00);
  AVar2 = Abc_EdgeFromNode(pAVar5);
  pIVar6 = Ivy_ManConst1(pIStack_18);
  pIVar6->TravId = AVar2;
  for (local_74 = 0; iVar3 = Abc_NtkPiNum((Abc_Ntk_t *)pMan_local), local_74 < iVar3;
      local_74 = local_74 + 1) {
    pAVar5 = Abc_NtkPi((Abc_Ntk_t *)pMan_local,local_74);
    AVar2 = Abc_EdgeFromNode((pAVar5->field_6).pCopy);
    pIVar6 = Ivy_ManPi(pIStack_18,local_74);
    pIVar6->TravId = AVar2;
  }
  vLatches = Ivy_ManDfsSeq(pIStack_18,(Vec_Int_t **)&pNtk);
  local_74 = 0;
  while( true ) {
    iVar3 = Vec_IntSize((Vec_Int_t *)pNtk);
    pIVar1 = pIStack_18;
    bVar8 = false;
    if (local_74 < iVar3) {
      iVar3 = Vec_IntEntry((Vec_Int_t *)pNtk,local_74);
      pTemp = Ivy_ManObj(pIVar1,iVar3);
      bVar8 = pTemp != (Ivy_Obj_t *)0x0;
    }
    if (!bVar8) break;
    pAVar5 = Abc_NtkCreateLatch(pNtk_00);
    pAVar7 = Abc_NtkCreateBi(pNtk_00);
    pObj_00 = Abc_NtkCreateBo(pNtk_00);
    Abc_ObjAddFanin(pAVar5,pAVar7);
    Abc_ObjAddFanin(pObj_00,pAVar5);
    if ((vNodes._4_4_ == 0) && (IVar4 = Ivy_ObjInit(pTemp), IVar4 != IVY_INIT_DC)) {
      IVar4 = Ivy_ObjInit(pTemp);
      if (IVar4 == IVY_INIT_1) {
        Abc_LatchSetInit1(pAVar5);
      }
      else {
        IVar4 = Ivy_ObjInit(pTemp);
        if (IVar4 != IVY_INIT_0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                        ,0x33c,"Abc_Ntk_t *Abc_NtkFromIvySeq(Abc_Ntk_t *, Ivy_Man_t *, int)");
        }
        Abc_LatchSetInit0(pAVar5);
      }
    }
    else {
      Abc_LatchSetInitDc(pAVar5);
    }
    AVar2 = Abc_EdgeFromNode(pObj_00);
    pTemp->TravId = AVar2;
    local_74 = local_74 + 1;
  }
  Abc_NtkAddDummyBoxNames(pNtk_00);
  local_74 = 0;
  while( true ) {
    iVar3 = Vec_IntSize(vLatches);
    pIVar1 = pIStack_18;
    bVar8 = false;
    if (local_74 < iVar3) {
      iVar3 = Vec_IntEntry(vLatches,local_74);
      pTemp = Ivy_ManObj(pIVar1,iVar3);
      bVar8 = pTemp != (Ivy_Obj_t *)0x0;
    }
    if (!bVar8) break;
    pAVar5 = Abc_ObjFanin0Ivy(pNtk_00,pTemp);
    iVar3 = Ivy_ObjIsBuf(pTemp);
    if (iVar3 == 0) {
      pAVar7 = Abc_ObjFanin1Ivy(pNtk_00,pTemp);
      iVar3 = Ivy_ObjIsExor(pTemp);
      if (iVar3 == 0) {
        pFaninNew = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar5,pAVar7);
      }
      else {
        pFaninNew = Abc_AigXor((Abc_Aig_t *)pNtk_00->pManFunc,pAVar5,pAVar7);
      }
      AVar2 = Abc_EdgeFromNode(pFaninNew);
      pTemp->TravId = AVar2;
      if (((vNodes._4_4_ != 0) && (pTemp->pEquiv != (Ivy_Obj_t *)0x0)) &&
         (iVar3 = Ivy_ObjRefs(pTemp), 0 < iVar3)) {
        pFaninNew0 = Abc_EdgeToNode(pNtk_00,pTemp->TravId);
        iVar3 = Ivy_IsComplement(pTemp->pEquiv);
        if (iVar3 != 0) {
          __assert_fail("!Ivy_IsComplement(pNode->pEquiv)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                        ,0x357,"Abc_Ntk_t *Abc_NtkFromIvySeq(Abc_Ntk_t *, Ivy_Man_t *, int)");
        }
        pIStack_70 = pTemp->pEquiv;
        while (pIStack_70 != pTemp) {
          pAVar5 = Abc_EdgeToNode(pNtk_00,pIStack_70->TravId);
          (pFaninNew0->field_5).pData = pAVar5;
          pIStack_70 = Ivy_Regular(pIStack_70->pEquiv);
          pFaninNew0 = pAVar5;
        }
        (pFaninNew0->field_5).pData = (void *)0x0;
      }
    }
    else {
      AVar2 = Abc_EdgeFromNode(pAVar5);
      pTemp->TravId = AVar2;
    }
    local_74 = local_74 + 1;
  }
  for (local_74 = 0; iVar3 = Abc_NtkPoNum((Abc_Ntk_t *)pMan_local), local_74 < iVar3;
      local_74 = local_74 + 1) {
    pAVar5 = Abc_NtkPo((Abc_Ntk_t *)pMan_local,local_74);
    pIVar6 = Ivy_ManPo(pIStack_18,local_74);
    pAVar7 = Abc_ObjFanin0Ivy(pNtk_00,pIVar6);
    Abc_ObjAddFanin((pAVar5->field_6).pCopy,pAVar7);
  }
  local_74 = 0;
  while( true ) {
    iVar3 = Vec_IntSize((Vec_Int_t *)pNtk);
    pIVar1 = pIStack_18;
    bVar8 = false;
    if (local_74 < iVar3) {
      iVar3 = Vec_IntEntry((Vec_Int_t *)pNtk,local_74);
      pTemp = Ivy_ManObj(pIVar1,iVar3);
      bVar8 = pTemp != (Ivy_Obj_t *)0x0;
    }
    if (!bVar8) break;
    pAVar5 = Abc_ObjFanin0Ivy(pNtk_00,pTemp);
    pAVar7 = Abc_NtkBox(pNtk_00,local_74);
    pAVar7 = Abc_ObjFanin0(pAVar7);
    Abc_ObjAddFanin(pAVar7,pAVar5);
    local_74 = local_74 + 1;
  }
  Vec_IntFree((Vec_Int_t *)pNtk);
  Vec_IntFree(vLatches);
  iVar3 = Abc_NtkCheck(pNtk_00);
  if (iVar3 == 0) {
    fprintf(_stdout,"Abc_NtkFromIvySeq(): Network check has failed.\n");
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromIvySeq( Abc_Ntk_t * pNtkOld, Ivy_Man_t * pMan, int fHaig )
{
    Vec_Int_t * vNodes, * vLatches;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj, * pObjNew, * pFaninNew, * pFaninNew0, * pFaninNew1;
    Ivy_Obj_t * pNode, * pTemp;
    int i;
//    assert( Ivy_ManLatchNum(pMan) > 0 );
    // perform strashing
    pNtk = Abc_NtkStartFromNoLatches( pNtkOld, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // transfer the pointers to the basic nodes
    Ivy_ManConst1(pMan)->TravId = Abc_EdgeFromNode( Abc_AigConst1(pNtk) );
    Abc_NtkForEachPi( pNtkOld, pObj, i )
        Ivy_ManPi(pMan, i)->TravId = Abc_EdgeFromNode( pObj->pCopy );
    // create latches of the new network
    vNodes = Ivy_ManDfsSeq( pMan, &vLatches );
    Ivy_ManForEachNodeVec( pMan, vLatches, pNode, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtk );
        pFaninNew0 = Abc_NtkCreateBi( pNtk );
        pFaninNew1 = Abc_NtkCreateBo( pNtk );
        Abc_ObjAddFanin( pObjNew, pFaninNew0 );
        Abc_ObjAddFanin( pFaninNew1, pObjNew );
        if ( fHaig || Ivy_ObjInit(pNode) == IVY_INIT_DC )
            Abc_LatchSetInitDc( pObjNew );
        else if ( Ivy_ObjInit(pNode) == IVY_INIT_1 )
            Abc_LatchSetInit1( pObjNew );
        else if ( Ivy_ObjInit(pNode) == IVY_INIT_0 )
            Abc_LatchSetInit0( pObjNew );
        else assert( 0 );
        pNode->TravId = Abc_EdgeFromNode( pFaninNew1 );
    }
    Abc_NtkAddDummyBoxNames( pNtk );
    // rebuild the AIG
    Ivy_ManForEachNodeVec( pMan, vNodes, pNode, i )
    {
        // add the first fanin
        pFaninNew0 = Abc_ObjFanin0Ivy( pNtk, pNode );
        if ( Ivy_ObjIsBuf(pNode) )
        {
            pNode->TravId = Abc_EdgeFromNode( pFaninNew0 );
            continue;
        }
        // add the second fanin
        pFaninNew1 = Abc_ObjFanin1Ivy( pNtk, pNode );
        // create the new node
        if ( Ivy_ObjIsExor(pNode) )
            pObjNew = Abc_AigXor( (Abc_Aig_t *)pNtk->pManFunc, pFaninNew0, pFaninNew1 );
        else
            pObjNew = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pFaninNew0, pFaninNew1 );
        pNode->TravId = Abc_EdgeFromNode( pObjNew );
        // process the choice nodes
        if ( fHaig && pNode->pEquiv && Ivy_ObjRefs(pNode) > 0 )
        {
            pFaninNew = Abc_EdgeToNode( pNtk, pNode->TravId );
//            pFaninNew->fPhase = 0;
            assert( !Ivy_IsComplement(pNode->pEquiv) );
            for ( pTemp = pNode->pEquiv; pTemp != pNode; pTemp = Ivy_Regular(pTemp->pEquiv) )
            {
                pFaninNew1 = Abc_EdgeToNode( pNtk, pTemp->TravId );
//                pFaninNew1->fPhase = Ivy_IsComplement( pTemp->pEquiv );
                pFaninNew->pData = pFaninNew1;
                pFaninNew = pFaninNew1;
            }
            pFaninNew->pData = NULL;
//            printf( "Writing choice node %d.\n", pNode->Id );
        }
    }
    // connect the PO nodes
    Abc_NtkForEachPo( pNtkOld, pObj, i )
    {
        pFaninNew = Abc_ObjFanin0Ivy( pNtk, Ivy_ManPo(pMan, i) );
        Abc_ObjAddFanin( pObj->pCopy, pFaninNew );
    }
    // connect the latches
    Ivy_ManForEachNodeVec( pMan, vLatches, pNode, i )
    {
        pFaninNew = Abc_ObjFanin0Ivy( pNtk, pNode );
        Abc_ObjAddFanin( Abc_ObjFanin0(Abc_NtkBox(pNtk, i)), pFaninNew );
    }
    Vec_IntFree( vLatches );
    Vec_IntFree( vNodes );
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkFromIvySeq(): Network check has failed.\n" );
    return pNtk;
}